

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnExceptionType
          (BinaryReaderIR *this,Index index,TypeVector *sig)

{
  Module *this_00;
  pointer pEVar1;
  unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>
  local_70 [3];
  Exception *local_58;
  Exception *except;
  unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_> local_30;
  unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_> field;
  TypeVector *sig_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::ExceptionModuleField_*,_std::default_delete<wabt::ExceptionModuleField>_>
  .super__Head_base<0UL,_wabt::ExceptionModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>,_true,_true>
        )(__uniq_ptr_data<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>,_true,_true>
          )sig;
  GetLocation((Location *)&except,this);
  MakeUnique<wabt::ExceptionModuleField,wabt::Location>((wabt *)&local_30,(Location *)&except);
  pEVar1 = std::
           unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>
           ::operator->(&local_30);
  local_58 = &pEVar1->except;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
            (&(pEVar1->except).sig,
             (vector<wabt::Type,_std::allocator<wabt::Type>_> *)
             field._M_t.
             super___uniq_ptr_impl<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::ExceptionModuleField_*,_std::default_delete<wabt::ExceptionModuleField>_>
             .super__Head_base<0UL,_wabt::ExceptionModuleField_*,_false>._M_head_impl);
  this_00 = this->module_;
  std::unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>::
  unique_ptr(local_70,&local_30);
  Module::AppendField(this_00,local_70);
  std::unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>::
  ~unique_ptr(local_70);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>::
  ~unique_ptr(&local_30);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnExceptionType(Index index, TypeVector& sig) {
  auto field = MakeUnique<ExceptionModuleField>(GetLocation());
  Exception& except = field->except;
  except.sig = sig;
  module_->AppendField(std::move(field));
  return Result::Ok;
}